

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

LongLong __thiscall
cmsys::SystemInformationImplementation::GetHostMemoryUsed(SystemInformationImplementation *this)

{
  int iVar1;
  LongLong *memAvail;
  LongLong *memTotal;
  LongLong *memCached;
  LongLong *memBuffers;
  LongLong *memFree;
  LongLong *memTotal_1;
  LongLong values4 [4];
  char *names4 [5];
  long lStack_48;
  int ierr;
  LongLong values2 [2];
  char *names2 [3];
  SystemInformationImplementation *this_local;
  
  values2[1] = (LongLong)anon_var_dwarf_dc3631;
  memset(&stack0xffffffffffffffb8,0,0x10);
  iVar1 = anon_unknown_3::GetFieldsFromFile<long_long>
                    ("/proc/meminfo",(char **)(values2 + 1),&stack0xffffffffffffffb8);
  if (iVar1 == 0) {
    this_local = (SystemInformationImplementation *)(lStack_48 - values2[0]);
  }
  else {
    memcpy(values4 + 3,&PTR_anon_var_dwarf_dc3631_00afcbb0,0x28);
    memset(&memTotal_1,0,0x20);
    iVar1 = anon_unknown_3::GetFieldsFromFile<long_long>
                      ("/proc/meminfo",(char **)(values4 + 3),(longlong *)&memTotal_1);
    if (iVar1 == 0) {
      this_local = (SystemInformationImplementation *)
                   ((long)memTotal_1 + ((-values4[1] - values4[0]) - values4[2]));
    }
    else {
      this_local = (SystemInformationImplementation *)(long)iVar1;
    }
  }
  return (LongLong)this_local;
}

Assistant:

SystemInformation::LongLong
SystemInformationImplementation::GetHostMemoryUsed()
{
#if defined(_WIN32)
#  if defined(_MSC_VER) && _MSC_VER < 1300
  MEMORYSTATUS stat;
  stat.dwLength = sizeof(stat);
  GlobalMemoryStatus(&stat);
  return (stat.dwTotalPhys - stat.dwAvailPhys) / 1024;
#  else
  MEMORYSTATUSEX statex;
  statex.dwLength = sizeof(statex);
  GlobalMemoryStatusEx(&statex);
  return (statex.ullTotalPhys - statex.ullAvailPhys) / 1024;
#  endif
#elif defined(__linux)
  // First try to use MemAvailable, but it only works on newer kernels
  const char* names2[3] = { "MemTotal:", "MemAvailable:", NULL };
  SystemInformation::LongLong values2[2] = { SystemInformation::LongLong(0) };
  int ierr = GetFieldsFromFile("/proc/meminfo", names2, values2);
  if (ierr) {
    const char* names4[5] = { "MemTotal:", "MemFree:", "Buffers:", "Cached:",
                              NULL };
    SystemInformation::LongLong values4[4] = { SystemInformation::LongLong(
      0) };
    ierr = GetFieldsFromFile("/proc/meminfo", names4, values4);
    if (ierr) {
      return ierr;
    }
    SystemInformation::LongLong& memTotal = values4[0];
    SystemInformation::LongLong& memFree = values4[1];
    SystemInformation::LongLong& memBuffers = values4[2];
    SystemInformation::LongLong& memCached = values4[3];
    return memTotal - memFree - memBuffers - memCached;
  }
  SystemInformation::LongLong& memTotal = values2[0];
  SystemInformation::LongLong& memAvail = values2[1];
  return memTotal - memAvail;
#elif defined(__APPLE__)
  SystemInformation::LongLong psz = getpagesize();
  if (psz < 1) {
    return -1;
  }
  const char* names[3] = { "Pages wired down:", "Pages active:",
                           KWSYS_NULLPTR };
  SystemInformation::LongLong values[2] = { SystemInformation::LongLong(0) };
  int ierr = GetFieldsFromCommand("vm_stat", names, values);
  if (ierr) {
    return -1;
  }
  SystemInformation::LongLong& vmWired = values[0];
  SystemInformation::LongLong& vmActive = values[1];
  return ((vmActive + vmWired) * psz) / 1024;
#else
  return 0;
#endif
}